

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O2

TGAColor __thiscall TRM::TGAImage::get(TGAImage *this,int x,int y)

{
  undefined8 in_RAX;
  undefined8 local_8;
  
  local_8 = in_RAX;
  if ((((y | x) < 0 || this->data == (uchar *)0x0) || (this->width <= x)) || (this->height <= y)) {
    TGAColor::TGAColor((TGAColor *)&local_8);
  }
  else {
    TGAColor::TGAColor((TGAColor *)&local_8,this->data + (this->width * y + x) * this->bytespp,
                       (uchar)this->bytespp);
  }
  return (TGAColor)((uint5)local_8._4_4_ << 0x20 | (uint5)(uint)local_8._0_4_);
}

Assistant:

TGAColor TGAImage::get(int x, int y) {
  if (!data || x < 0 || y < 0 || x >= width || y >= height) {
    return TGAColor();
  }
  return TGAColor(data + (x + y * width) * bytespp, bytespp);
}